

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::AvgState<double>,double,duckdb::NumericAverageOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  double *pdVar2;
  long *plVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_b0;
  UnifiedVectorFormat local_68;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      pdVar2 = (double *)input->data;
      plVar3 = *(long **)states->data;
      *plVar3 = *plVar3 + count;
      plVar3[1] = (long)((double)(long)count * *pdVar2 + (double)plVar3[1]);
    }
  }
  else if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
    pdVar4 = input->data;
    pdVar5 = states->data;
    FlatVector::VerifyFlatVector(input);
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar1 == (unsigned_long *)0x0) {
      if (count != 0) {
        iVar9 = 0;
        do {
          plVar3 = *(long **)(pdVar5 + iVar9 * 8);
          *plVar3 = *plVar3 + 1;
          plVar3[1] = (long)(*(double *)(pdVar4 + iVar9 * 8) + (double)plVar3[1]);
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar10 = 0;
      uVar11 = 0;
      do {
        uVar6 = puVar1[uVar10];
        uVar13 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar13 = count;
        }
        uVar12 = uVar13;
        if (uVar6 != 0) {
          uVar12 = uVar11;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar11 < uVar13) {
              do {
                plVar3 = *(long **)(pdVar5 + uVar12 * 8);
                *plVar3 = *plVar3 + 1;
                plVar3[1] = (long)(*(double *)(pdVar4 + uVar12 * 8) + (double)plVar3[1]);
                uVar12 = uVar12 + 1;
              } while (uVar13 != uVar12);
            }
          }
          else if (uVar11 < uVar13) {
            uVar12 = 0;
            do {
              if ((uVar6 >> (uVar12 & 0x3f) & 1) != 0) {
                plVar3 = *(long **)(pdVar5 + uVar12 * 8 + uVar11 * 8);
                *plVar3 = *plVar3 + 1;
                plVar3[1] = (long)(*(double *)(pdVar4 + uVar12 * 8 + uVar11 * 8) + (double)plVar3[1]
                                  );
              }
              uVar12 = uVar12 + 1;
            } while ((uVar11 - uVar13) + uVar12 != 0);
            uVar12 = uVar11 + uVar12;
          }
        }
        uVar10 = uVar10 + 1;
        uVar11 = uVar12;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_b0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_b0);
    Vector::ToUnifiedFormat(states,count,&local_68);
    if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar7 = (local_b0.sel)->sel_vector;
        psVar8 = (local_68.sel)->sel_vector;
        iVar9 = 0;
        do {
          iVar14 = iVar9;
          if (psVar7 != (sel_t *)0x0) {
            iVar14 = (idx_t)psVar7[iVar9];
          }
          iVar15 = iVar9;
          if (psVar8 != (sel_t *)0x0) {
            iVar15 = (idx_t)psVar8[iVar9];
          }
          plVar3 = *(long **)(local_68.data + iVar15 * 8);
          *plVar3 = *plVar3 + 1;
          plVar3[1] = (long)(*(double *)(local_b0.data + iVar14 * 8) + (double)plVar3[1]);
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
      }
    }
    else if (count != 0) {
      psVar7 = (local_b0.sel)->sel_vector;
      psVar8 = (local_68.sel)->sel_vector;
      iVar9 = 0;
      do {
        iVar14 = iVar9;
        if (psVar7 != (sel_t *)0x0) {
          iVar14 = (idx_t)psVar7[iVar9];
        }
        iVar15 = iVar9;
        if (psVar8 != (sel_t *)0x0) {
          iVar15 = (idx_t)psVar8[iVar9];
        }
        if ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar14 >> 6]
             >> (iVar14 & 0x3f) & 1) != 0) {
          plVar3 = *(long **)(local_68.data + iVar15 * 8);
          *plVar3 = *plVar3 + 1;
          plVar3[1] = (long)(*(double *)(local_b0.data + iVar14 * 8) + (double)plVar3[1]);
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_b0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}